

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

idx_t __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::upper_bound
          (Suffix_Array<unsigned_int> *this,idx_t *X,idx_t n,char *P,idx_t P_len)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  idx_t iVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  uint max_lcp;
  idx_t lcp_c;
  idx_t suf_len;
  char *suf;
  idx_t cutoff;
  idx_t lcp_r;
  idx_t lcp_l;
  idx_t soln;
  idx_t c;
  int64_t r;
  int64_t l;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar8;
  uint local_54;
  uint local_50;
  uint local_4c;
  idx_t local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  uint local_2c;
  long local_28;
  long local_18;
  
  local_38 = 0xffffffffffffffff;
  local_40 = (ulong)in_EDX;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0x10000;
  local_48 = in_EDX;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_18 = in_RSI;
  while( true ) {
    while( true ) {
      while( true ) {
        if ((long)(local_40 - local_38) < 2) {
          return local_48;
        }
        uVar6 = (long)(local_38 + local_40) / 2;
        local_44 = (uint)uVar6;
        lVar2 = *in_RDI;
        uVar1 = *(uint *)(local_18 + (uVar6 & 0xffffffff) * 4);
        uVar3 = (int)in_RDI[1] - *(int *)(local_18 + (uVar6 & 0xffffffff) * 4);
        std::min<unsigned_int>(&local_4c,&local_50);
        puVar7 = std::min<unsigned_int>((uint *)&stack0xffffffffffffff98,&local_54);
        uVar5 = *puVar7;
        puVar7 = std::min<unsigned_int>((uint *)&stack0xffffffffffffff9c,&local_2c);
        std::min<unsigned_int>(puVar7,(uint *)((long)in_RDI + 0x34));
        puVar7 = std::min<unsigned_int>((uint *)&stack0xffffffffffffff94,&local_54);
        uVar8 = *puVar7;
        iVar4 = LCP<8ul>((char *)CONCAT44(uVar3,uVar5),
                         (char *)CONCAT44(uVar8,in_stack_ffffffffffffff90),
                         (idx_t)((ulong)in_RDI >> 0x20));
        uVar5 = iVar4 + uVar5;
        if (uVar5 == uVar8) break;
        if (*(char *)(lVar2 + (ulong)uVar1 + (ulong)uVar5) < *(char *)(local_28 + (ulong)uVar5)) {
          local_38 = (ulong)local_44;
          local_4c = uVar5;
        }
        else {
          local_40 = (ulong)local_44;
          local_48 = local_44;
          local_50 = uVar5;
        }
      }
      if (uVar5 == local_2c) break;
      local_38 = (ulong)local_44;
      local_4c = uVar5;
    }
    if (local_2c == uVar3) break;
    local_40 = (ulong)local_44;
    local_48 = local_44;
    local_50 = uVar5;
  }
  return local_44 + 1;
}

Assistant:

T_idx_ Suffix_Array<T_idx_>::upper_bound(const idx_t* const X, const idx_t n, const char* const P, const idx_t P_len) const
{
    // Invariant: SA[l] < P < SA[r].

    int64_t l = -1, r = n;  // (Exclusive-) Range of the iterations in the binary search.
    idx_t c;    // Midpoint in each iteration.
    idx_t soln = n; // Solution of the search.
    idx_t lcp_l = 0, lcp_r = 0; // LCP(P, SA[l]) and LCP(P, SA[r]).
	constexpr idx_t cutoff = 65536; // TODO: better tune and document.

    while(r - l > 1)    // Candidate matches exist.
    {
        c = (l + r) / 2;
        auto const suf = T_ + X[c]; // The suffix at the middle.
        const auto suf_len = n_ - X[c]; // Length of the suffix.

        idx_t lcp_c = std::min(lcp_l, lcp_r);   // LCP(X[c], P).
        lcp_c = std::min(lcp_c, cutoff);
        auto max_lcp = std::min(std::min(suf_len, P_len), max_context); // Maximum possible LCP, i.e. length of the shorter string.
        max_lcp = std::min(max_lcp, cutoff);
        lcp_c += LCP(suf + lcp_c, P + lcp_c, max_lcp - lcp_c);  // Skip an informed number of character comparisons.

        if(lcp_c == max_lcp)    // One is a prefix of the other, or they align at least up-to the context- or the cutoff-length.
        {
            if(lcp_c == P_len)  // P is a prefix of the suffix.
            {
                if(P_len == suf_len)    // The query is the suffix itself, i.e. P = X[c]
                    return c + 1;
                else    // P < X[c]
                    r = c, lcp_r = lcp_c, soln = c;
            }
            else    // The suffix is a prefix of the query, so X[c] < P; technically impossible if the text terminates with $.
                    // Or, their relevant prefixes align; moving to the right, as searching for the upper-bound.
                l = c, lcp_l = lcp_c;
        }
        else    // They mismatch within their relevant prefixes.
            if(suf[lcp_c] < P[lcp_c])   // X[c] < P
                l = c, lcp_l = lcp_c;
            else    // P < X[c]
                r = c, lcp_r = lcp_c, soln = c;
    }


    return soln;
}